

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O0

PAL_ERROR CorUnix::PALCS_WakeUpWaiter(PAL_CRITICAL_SECTION *pPalCriticalSection)

{
  PalCsInitState PVar1;
  int iVar2;
  uint uVar3;
  PAL_ERROR local_18;
  PAL_ERROR palErr;
  int iRet;
  PAL_CRITICAL_SECTION *pPalCriticalSection_local;
  
  local_18 = 0;
  PVar1 = ::Volatile::operator_cast_to_PalCsInitState
                    ((Volatile *)&pPalCriticalSection->cisInitState);
  if (PVar1 != PalCsFullyInitialized) {
    fprintf(_stderr,"] %s %s:%d","PALCS_WakeUpWaiter",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0x511);
    fprintf(_stderr,
            "Expression: PalCsFullyInitialized == pPalCriticalSection->cisInitState, Description: Trying to wake up a waiter on CS not fully initialized\n"
           );
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&pPalCriticalSection->csndNativeData);
  if (iVar2 == 0) {
    (pPalCriticalSection->csndNativeData).iPredicate = 1;
    uVar3 = pthread_cond_signal((pthread_cond_t *)&(pPalCriticalSection->csndNativeData).condition);
    if (uVar3 != 0) {
      fprintf(_stderr,"] %s %s:%d","PALCS_WakeUpWaiter",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
              ,0x528);
      fprintf(_stderr,"Failed setting condition in CS %p [ret=%d]\n",pPalCriticalSection,
              (ulong)uVar3);
      local_18 = 0x54f;
    }
    iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&pPalCriticalSection->csndNativeData);
    if (iVar2 != 0) {
      local_18 = 0x54f;
    }
  }
  else {
    local_18 = 0x54f;
  }
  return local_18;
}

Assistant:

PAL_ERROR PALCS_WakeUpWaiter(PAL_CRITICAL_SECTION * pPalCriticalSection)
    {
        int iRet;
        PAL_ERROR palErr = NO_ERROR;

        _ASSERT_MSG(PalCsFullyInitialized == pPalCriticalSection->cisInitState,
                    "Trying to wake up a waiter on CS not fully initialized\n");

        // Lock the mutex
        iRet = pthread_mutex_lock(&pPalCriticalSection->csndNativeData.mutex);
        if (0 != iRet)
        {
            palErr = ERROR_INTERNAL_ERROR;
            goto PCWUW_exit;
        }

        // Set the predicate
        pPalCriticalSection->csndNativeData.iPredicate = 1;

        CS_TRACE("Signaling condition/predicate [pred=%d]!\n",
                 pPalCriticalSection->csndNativeData.iPredicate);

        // Signal the condition
        iRet = pthread_cond_signal(&pPalCriticalSection->csndNativeData.condition);
        if (0 != iRet)
        {
            // Failed: set palErr, but continue in order to unlock
            // the mutex anyway
            ASSERT("Failed setting condition in CS %p [ret=%d]\n",
                   pPalCriticalSection, iRet);
            palErr = ERROR_INTERNAL_ERROR;
        }

        // Unlock the mutex
        iRet = pthread_mutex_unlock(&pPalCriticalSection->csndNativeData.mutex);
        if (0 != iRet)
        {
            palErr = ERROR_INTERNAL_ERROR;
            goto PCWUW_exit;
        }

    PCWUW_exit:
        return palErr;
    }